

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.h
# Opt level: O3

cmCommand * __thiscall cmSetPropertyCommand::Clone(cmSetPropertyCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0xa8);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmSetPropertyCommand_0069d7b0;
  *(undefined4 *)&pcVar1[1].Makefile = 0;
  pcVar1[1].Error._M_dataplus._M_p = (pointer)0x0;
  pcVar1[1].Error._M_string_length = (size_type)&pcVar1[1].Makefile;
  pcVar1[1].Error.field_2._M_allocated_capacity = (size_type)&pcVar1[1].Makefile;
  *(undefined8 *)((long)&pcVar1[1].Error.field_2 + 8) = 0;
  pcVar1[2]._vptr_cmCommand = (_func_int **)&pcVar1[2].Error;
  pcVar1[2].Makefile = (cmMakefile *)0x0;
  *(undefined1 *)&pcVar1[2].Error._M_dataplus._M_p = 0;
  pcVar1[2].Error.field_2._M_allocated_capacity = (size_type)(pcVar1 + 3);
  *(undefined8 *)((long)&pcVar1[2].Error.field_2 + 8) = 0;
  *(undefined1 *)&pcVar1[3]._vptr_cmCommand = 0;
  *(undefined2 *)((long)&pcVar1[3].Error._M_dataplus._M_p + 1) = 0;
  *(undefined1 *)&pcVar1[3].Error._M_dataplus._M_p = 1;
  return pcVar1;
}

Assistant:

cmCommand* Clone() override { return new cmSetPropertyCommand; }